

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# hanabi_hand.cc
# Opt level: O0

string * __thiscall
hanabi_learning_env::HanabiHand::CardKnowledge::ToString_abi_cxx11_(CardKnowledge *this)

{
  bool bVar1;
  char cVar2;
  int iVar3;
  string *in_RDI;
  int r;
  int c;
  string *result;
  int in_stack_ffffffffffffff2c;
  undefined2 in_stack_ffffffffffffff30;
  char in_stack_ffffffffffffff32;
  uint in_stack_ffffffffffffff33;
  undefined4 uVar4;
  char in_stack_ffffffffffffff37;
  undefined1 uVar5;
  undefined4 in_stack_ffffffffffffff38;
  undefined2 in_stack_ffffffffffffff3c;
  undefined1 in_stack_ffffffffffffff3e;
  undefined1 in_stack_ffffffffffffff3f;
  undefined4 in_stack_ffffffffffffff44;
  undefined2 in_stack_ffffffffffffff48;
  undefined1 in_stack_ffffffffffffff4a;
  undefined1 in_stack_ffffffffffffff4b;
  undefined4 in_stack_ffffffffffffff4c;
  int local_8c;
  int local_88;
  string local_78 [32];
  string local_58 [32];
  string local_38 [39];
  undefined1 local_11;
  
  cVar2 = (char)((uint)in_stack_ffffffffffffff44 >> 0x18);
  local_11 = 0;
  std::__cxx11::string::string(in_RDI);
  bVar1 = ColorHinted((CardKnowledge *)0x146258);
  if (bVar1) {
    iVar3 = Color((CardKnowledge *)0x146272);
    ColorIndexToChar(iVar3);
  }
  std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                 CONCAT44(in_stack_ffffffffffffff4c,
                          CONCAT13(in_stack_ffffffffffffff4b,
                                   CONCAT12(in_stack_ffffffffffffff4a,in_stack_ffffffffffffff48))),
                 cVar2);
  bVar1 = RankHinted((CardKnowledge *)0x1462bb);
  if (bVar1) {
    iVar3 = Rank((CardKnowledge *)0x1462d5);
    RankIndexToChar(iVar3);
  }
  std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                 CONCAT17(in_stack_ffffffffffffff3f,
                          CONCAT16(in_stack_ffffffffffffff3e,
                                   CONCAT24(in_stack_ffffffffffffff3c,in_stack_ffffffffffffff38))),
                 in_stack_ffffffffffffff37);
  std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                 CONCAT17(in_stack_ffffffffffffff3f,
                          CONCAT16(in_stack_ffffffffffffff3e,
                                   CONCAT24(in_stack_ffffffffffffff3c,in_stack_ffffffffffffff38))),
                 in_stack_ffffffffffffff37);
  std::__cxx11::string::operator=(in_RDI,local_38);
  std::__cxx11::string::~string(local_38);
  std::__cxx11::string::~string(local_58);
  std::__cxx11::string::~string(local_78);
  for (local_88 = 0; iVar3 = ValueKnowledge::Range((ValueKnowledge *)0x146383), local_88 < iVar3;
      local_88 = local_88 + 1) {
    bVar1 = ValueKnowledge::IsPlausible
                      ((ValueKnowledge *)
                       CONCAT17(in_stack_ffffffffffffff37,
                                CONCAT43(in_stack_ffffffffffffff33,
                                         CONCAT12(in_stack_ffffffffffffff32,
                                                  in_stack_ffffffffffffff30))),
                       in_stack_ffffffffffffff2c);
    if (bVar1) {
      cVar2 = ColorIndexToChar(local_88);
      std::__cxx11::string::operator+=(in_RDI,cVar2);
    }
  }
  local_8c = 0;
  while( true ) {
    uVar4 = CONCAT31((int3)local_8c,(char)in_stack_ffffffffffffff33);
    uVar5 = (undefined1)((uint)local_8c >> 0x18);
    iVar3 = ValueKnowledge::Range((ValueKnowledge *)0x146458);
    if (iVar3 <= CONCAT13(uVar5,(int3)((uint)uVar4 >> 8))) break;
    bVar1 = ValueKnowledge::IsPlausible
                      ((ValueKnowledge *)
                       CONCAT17(uVar5,CONCAT43(uVar4,CONCAT12(in_stack_ffffffffffffff32,
                                                              in_stack_ffffffffffffff30))),
                       in_stack_ffffffffffffff2c);
    in_stack_ffffffffffffff33 = (uint)bVar1;
    if (bVar1) {
      in_stack_ffffffffffffff32 = RankIndexToChar(local_8c);
      std::__cxx11::string::operator+=(in_RDI,in_stack_ffffffffffffff32);
    }
    local_8c = local_8c + 1;
  }
  return in_RDI;
}

Assistant:

std::string HanabiHand::CardKnowledge::ToString() const {
  std::string result;
  result = result + (ColorHinted() ? ColorIndexToChar(Color()) : 'X') +
           (RankHinted() ? RankIndexToChar(Rank()) : 'X') + '|';
  for (int c = 0; c < color_.Range(); ++c) {
    if (color_.IsPlausible(c)) {
      result += ColorIndexToChar(c);
    }
  }
  for (int r = 0; r < rank_.Range(); ++r) {
    if (rank_.IsPlausible(r)) {
      result += RankIndexToChar(r);
    }
  }
  return result;
}